

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node_struct *n,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node local_f8;
  xpath_node local_f0;
  xml_node local_e0;
  xpath_node local_d8;
  xml_node local_c8;
  xpath_node local_c0;
  xml_node local_b0;
  xpath_node local_a8;
  xml_node local_98;
  xpath_node local_90;
  xml_node local_80;
  xpath_node local_78;
  xml_node local_68;
  xpath_node local_60;
  xml_node local_50;
  xpath_node local_48;
  uint local_34;
  xpath_allocator *pxStack_30;
  xml_node_type type;
  xpath_allocator *alloc_local;
  xml_node_struct *n_local;
  xpath_node_set_raw *ns_local;
  xpath_ast_node *this_local;
  
  pxStack_30 = alloc;
  alloc_local = (xpath_allocator *)n;
  n_local = (xml_node_struct *)ns;
  ns_local = (xpath_node_set_raw *)this;
  if (n == (xml_node_struct *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x276a,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  local_34 = (uint)n->header & 0xf;
  switch(this->_test) {
  case '\x01':
    if (((local_34 == 2) && (n->name != (char_t *)0x0)) &&
       (bVar2 = strequal(n->name,(this->_data).string), pxVar1 = n_local, bVar2)) {
      xml_node::xml_node(&local_50,(xml_node_struct *)alloc_local);
      xpath_node::xpath_node(&local_48,&local_50);
      xpath_node_set_raw::push_back((xpath_node_set_raw *)pxVar1,&local_48,pxStack_30);
      return true;
    }
    break;
  case '\x02':
    xml_node::xml_node(&local_68,n);
    xpath_node::xpath_node(&local_60,&local_68);
    xpath_node_set_raw::push_back(ns,&local_60,pxStack_30);
    return true;
  case '\x03':
    if (local_34 == 5) {
      xml_node::xml_node(&local_80,n);
      xpath_node::xpath_node(&local_78,&local_80);
      xpath_node_set_raw::push_back(ns,&local_78,pxStack_30);
      return true;
    }
    break;
  case '\x04':
    if (local_34 == 6) {
      xml_node::xml_node(&local_b0,n);
      xpath_node::xpath_node(&local_a8,&local_b0);
      xpath_node_set_raw::push_back(ns,&local_a8,pxStack_30);
      return true;
    }
    break;
  case '\x05':
    if ((local_34 == 3) || (local_34 == 4)) {
      xml_node::xml_node(&local_98,n);
      xpath_node::xpath_node(&local_90,&local_98);
      xpath_node_set_raw::push_back(ns,&local_90,pxStack_30);
      return true;
    }
    break;
  case '\x06':
    if (((local_34 == 6) && (n->name != (char_t *)0x0)) &&
       (bVar2 = strequal(n->name,(this->_data).string), pxVar1 = n_local, bVar2)) {
      xml_node::xml_node(&local_c8,(xml_node_struct *)alloc_local);
      xpath_node::xpath_node(&local_c0,&local_c8);
      xpath_node_set_raw::push_back((xpath_node_set_raw *)pxVar1,&local_c0,pxStack_30);
      return true;
    }
    break;
  case '\a':
    if (local_34 == 2) {
      xml_node::xml_node(&local_e0,n);
      xpath_node::xpath_node(&local_d8,&local_e0);
      xpath_node_set_raw::push_back(ns,&local_d8,pxStack_30);
      return true;
    }
    break;
  case '\b':
    if (((local_34 == 2) && (n->name != (char_t *)0x0)) &&
       (bVar2 = starts_with(n->name,(this->_data).string), pxVar1 = n_local, bVar2)) {
      xml_node::xml_node(&local_f8,(xml_node_struct *)alloc_local);
      xpath_node::xpath_node(&local_f0,&local_f8);
      xpath_node_set_raw::push_back((xpath_node_set_raw *)pxVar1,&local_f0,pxStack_30);
      return true;
    }
    break;
  default:
    __assert_fail("false && \"Unknown axis\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x27ad,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  return false;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc)
		{
			assert(n);

			xml_node_type type = PUGI_IMPL_NODETYPE(n);

			switch (_test)
			{
			case nodetest_name:
				if (type == node_element && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
				ns.push_back(xml_node(n), alloc);
				return true;

			case nodetest_type_comment:
				if (type == node_comment)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_text:
				if (type == node_pcdata || type == node_cdata)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_pi:
				if (type == node_pi)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_pi:
				if (type == node_pi && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all:
				if (type == node_element)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (type == node_element && n->name && starts_with(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			default:
				assert(false && "Unknown axis"); // unreachable
			}

			return false;
		}